

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

size_t __thiscall
andres::View<float,_false,_std::allocator<unsigned_long>_>::elementAccessHelper<unsigned_long>
          (View<float,_false,_std::allocator<unsigned_long>_> *this,size_t Dim,size_t value,
          unsigned_long args)

{
  size_t sVar1;
  size_t sVar2;
  unsigned_long args_local;
  size_t value_local;
  size_t Dim_local;
  View<float,_false,_std::allocator<unsigned_long>_> *this_local;
  
  sVar1 = shape(this,Dim - 2);
  marray_detail::Assert<bool>(value < sVar1);
  sVar1 = strides(this,Dim - 2);
  sVar2 = elementAccessHelper(this,Dim,args);
  return value * sVar1 + sVar2;
}

Assistant:

inline std::size_t
View<T, isConst, A>::elementAccessHelper
(
    const std::size_t Dim, 
    const std::size_t value, 
    const Args... args
)
{
    marray_detail::Assert(MARRAY_NO_ARG_TEST || (value < shape(Dim-1-sizeof...(args)) ) );      
    return value * strides(Dim-1-sizeof...(args)) + elementAccessHelper(Dim, args...); 
}